

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

void __thiscall
gmath::EquidistantDistortion::invTransform
          (EquidistantDistortion *this,double *xd,double *yd,double xx,double yy)

{
  double __x;
  double x [1];
  long ltmp [1];
  double fvec [1];
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dtmp [7];
  
  __x = xx * xx + yy * yy;
  if (__x < 0.0) {
    x[0] = sqrt(__x);
  }
  else {
    x[0] = SQRT(__x);
  }
  *xd = xx;
  *yd = yy;
  if (1e-09 < x[0]) {
    local_88 = this->ed[0];
    dStack_80 = this->ed[1];
    local_78 = this->ed[2];
    dStack_70 = this->ed[3];
    ltmp[0] = 0;
    dtmp[6] = 0.0;
    dtmp[4] = 0.0;
    dtmp[5] = 0.0;
    dtmp[2] = 0.0;
    dtmp[3] = 0.0;
    dtmp[0] = 0.0;
    dtmp[1] = 0.0;
    local_68 = x[0];
    slmdif(anon_unknown_0::computeEquidistantDistortion,1,1,x,fvec,&local_88,1e-06,0.0,ltmp,dtmp);
    *xd = *xd * (x[0] / local_68);
    *yd = (x[0] / local_68) * *yd;
  }
  return;
}

Assistant:

void EquidistantDistortion::invTransform(double &xd, double &yd, double xx, double yy) const
{
  // equidistant distortion model

  double x[1]= { std::sqrt(xx*xx+yy*yy) };

  xd=xx;
  yd=yy;

  if (x[0] > 1e-9)
  {
    EquidistantDistortionParameter param;

    param.ed[0]=ed[0];
    param.ed[1]=ed[1];
    param.ed[2]=ed[2];
    param.ed[3]=ed[3];
    param.radius=x[0];

    double fvec[1];

    long ltmp[1]= {0};
    double dtmp[7];

    memset(dtmp, 0, 7*sizeof(double));
    gmath::slmdif(computeEquidistantDistortion, 1, 1, x, fvec, &param, 1e-6, 0, ltmp, dtmp);

    xd*=x[0]/param.radius;
    yd*=x[0]/param.radius;
  }
}